

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::init
          (SSBOArrayLengthCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *sources;
  TestLog *log;
  TestError *pTVar6;
  allocator<char> local_279;
  string local_278;
  undefined1 local_252;
  allocator<char> local_251;
  string local_250;
  int local_230 [2];
  GLint result_2;
  GLenum prop_2;
  deUint32 index_2;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  int local_1d8 [2];
  GLint result_1;
  GLenum prop_1;
  deUint32 index_1;
  undefined1 local_1a2;
  allocator<char> local_1a1;
  string local_1a0;
  int local_180 [2];
  GLint result;
  GLenum prop;
  deUint32 index;
  undefined1 local_149;
  string local_148;
  ShaderSource local_128;
  ProgramSources local_100;
  undefined4 local_1c;
  long lStack_18;
  deUint32 invalidValue;
  Functions *gl;
  SSBOArrayLengthCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar3);
  local_1c = 0xffffffff;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_149 = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_100);
  (anonymous_namespace)::SSBOArrayLengthCase::genComputeSource_abi_cxx11_(&local_148,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_128,&local_148);
  sources = glu::ProgramSources::operator<<(&local_100,&local_128);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar5,sources);
  local_149 = 0;
  this->m_shader = this_00;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  glu::ProgramSources::~ProgramSources(&local_100);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_shader);
  bVar2 = glu::ShaderProgram::isOk(this->m_shader);
  if (!bVar2) {
    prop._2_1_ = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index,"Failed to build shader",(allocator<char> *)((long)&prop + 3));
    tcu::TestError::TestError(pTVar6,(string *)&index);
    prop._2_1_ = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_18 + 0x6c8))(1,&this->m_outputBufferID);
  (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_outputBufferID);
  (**(code **)(lStack_18 + 0x150))(0x90d2,8,&local_1c,0x88ea);
  (**(code **)(lStack_18 + 0x6c8))(1,&this->m_targetBufferID);
  (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_targetBufferID);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"create buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x6e);
  (**(code **)(lStack_18 + 0x48))(0x90d2,0,this->m_outputBufferID);
  (**(code **)(lStack_18 + 0x48))(0x90d2,1,this->m_targetBufferID);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"bind buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x73);
  pcVar1 = *(code **)(lStack_18 + 0x9a8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  result = (*pcVar1)(dVar4,0x92e5,"Out.outLength");
  local_180[1] = 0x92fc;
  local_180[0] = 0;
  if (result == -1) {
    local_1a2 = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Failed to find outLength variable",&local_1a1);
    tcu::TestError::TestError(pTVar6,&local_1a0);
    local_1a2 = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x9c8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  (*pcVar1)(dVar4,0x92e5,result,1,local_180 + 1,1,0,local_180);
  if (local_180[0] != 0) {
    prop_1._2_1_ = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index_1,"Unexpected outLength location",
               (allocator<char> *)((long)&prop_1 + 3));
    tcu::TestError::TestError(pTVar6,(string *)&index_1);
    prop_1._2_1_ = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x9a8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  result_1 = (*pcVar1)(dVar4,0x92e5,"Out.unused");
  local_1d8[1] = 0x92fc;
  local_1d8[0] = 0;
  if (result_1 == -1) {
    local_1fa = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Failed to find unused variable",&local_1f9);
    tcu::TestError::TestError(pTVar6,&local_1f8);
    local_1fa = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x9c8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  (*pcVar1)(dVar4,0x92e5,result_1,1,local_1d8 + 1,1,0,local_1d8);
  if (local_1d8[0] != 4) {
    prop_2._2_1_ = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index_2,"Unexpected unused location",
               (allocator<char> *)((long)&prop_2 + 3));
    tcu::TestError::TestError(pTVar6,(string *)&index_2);
    prop_2._2_1_ = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x9a8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  result_2 = (*pcVar1)(dVar4,0x92e5,"Target.array");
  local_230[1] = 0x92fe;
  local_230[0] = 0;
  if (result_2 == -1) {
    local_252 = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"Failed to find array variable",&local_251);
    tcu::TestError::TestError(pTVar6,&local_250);
    local_252 = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x9c8);
  dVar4 = glu::ShaderProgram::getProgram(this->m_shader);
  iVar3 = (*pcVar1)(dVar4,0x92e5,result_2,1,local_230 + 1,1,0,local_230);
  if (local_230[0] != 4) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Unexpected array stride",&local_279);
    tcu::TestError::TestError(pTVar6,&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return iVar3;
}

Assistant:

void SSBOArrayLengthCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			invalidValue	= 0xFFFFFFFFUL;

	// program
	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_shader;

	if (!m_shader->isOk())
		throw tcu::TestError("Failed to build shader");

	// gen and attach buffers
	gl.genBuffers(1, &m_outputBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, 2 * (int)sizeof(deUint32), &invalidValue, GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_targetBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "create buffers");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBufferID);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffers");

	// check the ssbo has expected layout
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.outLength");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find outLength variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 0)
			throw tcu::TestError("Unexpected outLength location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.unused");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find unused variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected unused location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Target.array");
		const glw::GLenum	prop	= GL_ARRAY_STRIDE;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find array variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected array stride");
	}
}